

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ExpressionVarVisitor::visit<slang::ast::NewArrayExpression>
          (ExpressionVarVisitor *this,NewArrayExpression *expr)

{
  bool bVar1;
  Symbol *pSVar2;
  int *in_RSI;
  NewArrayExpression *in_RDI;
  Symbol *sym;
  Expression *in_stack_00000028;
  ExpressionVarVisitor *in_stack_ffffffffffffffd8;
  
  if (*in_RSI == 8 || *in_RSI == 9) {
    pSVar2 = Expression::getSymbolReference(in_stack_00000028,this._7_1_);
    if ((pSVar2 != (Symbol *)0x0) && (bVar1 = VariableSymbol::isKind(pSVar2->kind), bVar1)) {
      *(undefined1 *)&(in_RDI->super_Expression).kind = IntegerLiteral;
    }
  }
  else {
    NewArrayExpression::visitExprs<slang::ast::ExpressionVarVisitor&>
              (in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (VariableSymbol::isKind(sym->kind))
                            anyVars = true;
                    }
                    break;
                }
                default:
                    if constexpr (HasVisitExprs<T, ExpressionVarVisitor>) {
                        expr.visitExprs(*this);
                    }
                    break;
            }
        }
    }